

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_network.cpp
# Opt level: O2

void __thiscall
neural_networks::NeuralNetwork::back_propogate
          (NeuralNetwork *this,vector<long_double,_std::allocator<long_double>_> *correct_data)

{
  longdouble lVar1;
  pointer ppNVar2;
  size_t sVar3;
  NeuralLayer *pNVar4;
  NeuralMatrix *pNVar5;
  long lVar6;
  int iVar7;
  Matrix<long_double> *pMVar8;
  longdouble *plVar9;
  undefined4 extraout_var;
  Matrix<long_double> *pMVar10;
  length_error *this_00;
  long lVar11;
  size_t sVar12;
  Matrix<long_double> **item;
  long lVar13;
  size_t sVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  longdouble lVar18;
  allocator_type local_51;
  vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
  error_vectors;
  value_type local_38;
  
  ppNVar2 = (this->layers).
            super__Vector_base<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)(correct_data->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(correct_data->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 4 !=
      (ppNVar2[-1]->data->super_Matrix<neural_networks::utilities::Neuron_*>).N) {
    this_00 = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error
              (this_00,"Length of given dataset doesn\'t match up with output layer");
    __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  local_38 = (value_type)0x0;
  std::
  vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
  ::vector(&error_vectors,
           (long)ppNVar2 -
           (long)(this->layers).
                 super__Vector_base<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3,&local_38,&local_51);
  pMVar8 = utilities::matrix_operators::create
                     ((this->layers).
                      super__Vector_base<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1]->data,function);
  error_vectors.
  super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pMVar8;
  plVar9 = (correct_data->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar11 = (long)(correct_data->super__Vector_base<long_double,_std::allocator<long_double>_>).
                 _M_impl.super__Vector_impl_data._M_finish - (long)plVar9 >> 4;
  ppNVar2 = (this->layers).
            super__Vector_base<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  lVar13 = 0;
  while (bVar17 = lVar11 != 0, lVar11 = lVar11 + -1, bVar17) {
    lVar15 = **(long **)((long)&(((ppNVar2[-1]->data->
                                  super_Matrix<neural_networks::utilities::Neuron_*>).matrix.
                                  super__Vector_base<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>,_std::allocator<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>
                                )._M_impl.super__Vector_impl_data._M_start + lVar13);
    **(longdouble **)
      (*(long *)(*(long *)((long)error_vectors.
                                 super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start +
                          ((long)error_vectors.
                                 super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)error_vectors.
                                super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) + -8) + 8) + lVar13) =
         *(longdouble *)(lVar15 + 0x30) * (*(longdouble *)(lVar15 + 0x20) - *plVar9);
    lVar13 = lVar13 + 0x18;
    plVar9 = plVar9 + 1;
  }
  lVar11 = ((long)error_vectors.
                  super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)error_vectors.
                  super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) + -2;
  while (lVar11 != 0) {
    iVar7 = (*(this->layers).
              super__Vector_base<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar11 + 1]->weights->_vptr_Matrix[2])();
    pMVar8 = (Matrix<long_double> *)CONCAT44(extraout_var,iVar7);
    pMVar10 = utilities::Matrix<long_double>::operator*
                        (pMVar8,error_vectors.
                                super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar11 + 1]);
    sVar3 = pMVar10->N;
    ppNVar2 = (this->layers).
              super__Vector_base<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (sVar12 = 0; sVar12 != sVar3; sVar12 = sVar12 + 1) {
      lVar1 = this->learning_rate;
      pNVar4 = ppNVar2[lVar11];
      lVar13 = sVar12 * 0x18;
      plVar9 = (pMVar10->matrix).
               super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[sVar12].
               super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar18 = *plVar9 * *(longdouble *)
                          (**(long **)(*(long *)&(pNVar4->data->
                                                 super_Matrix<neural_networks::utilities::Neuron_*>)
                                                 .matrix.
                                                 super__Vector_base<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>,_std::allocator<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>_>_>
                                                 ._M_impl.super__Vector_impl_data + lVar13) + 0x30);
      *plVar9 = lVar18;
      lVar18 = lVar18 * lVar1;
      plVar9 = *(longdouble **)
                (*(long *)&(pNVar4->bias->matrix).
                           super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                           ._M_impl.super__Vector_impl_data + lVar13);
      *plVar9 = *plVar9 - lVar18;
      pNVar5 = ppNVar2[lVar11 + -1]->data;
      sVar14 = (pNVar5->super_Matrix<neural_networks::utilities::Neuron_*>).N;
      lVar15 = 0;
      lVar16 = 0;
      while (bVar17 = sVar14 != 0, sVar14 = sVar14 - 1, bVar17) {
        lVar6 = *(long *)(*(long *)&(pNVar4->weights->matrix).
                                    super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                                    ._M_impl.super__Vector_impl_data + lVar13);
        *(longdouble *)(lVar6 + lVar16) =
             *(longdouble *)(lVar6 + lVar16) -
             *(longdouble *)
              (**(long **)(*(long *)&(pNVar5->super_Matrix<neural_networks::utilities::Neuron_*>).
                                     matrix.
                                     super__Vector_base<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>,_std::allocator<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>_>_>
                                     ._M_impl.super__Vector_impl_data + lVar15) + 0x10) * lVar18;
        lVar16 = lVar16 + 0x10;
        lVar15 = lVar15 + 0x18;
      }
    }
    (*pMVar10->_vptr_Matrix[5])(pMVar10);
    error_vectors.
    super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
    ._M_impl.super__Vector_impl_data._M_start[lVar11] = pMVar10;
    (*pMVar8->_vptr_Matrix[4])(pMVar8);
    lVar11 = lVar11 + -1;
  }
  if (*error_vectors.
       super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
       ._M_impl.super__Vector_impl_data._M_start != (Matrix<long_double> *)0x0) {
    std::operator<<((ostream *)&std::cerr,"Error: the 0th index of error_vector non-null\n");
  }
  for (; error_vectors.
         super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         error_vectors.
         super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      error_vectors.
      super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
      ._M_impl.super__Vector_impl_data._M_start =
           error_vectors.
           super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    if (*error_vectors.
         super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
         ._M_impl.super__Vector_impl_data._M_start != (Matrix<long_double> *)0x0) {
      (*(*error_vectors.
          super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
          ._M_impl.super__Vector_impl_data._M_start)->_vptr_Matrix[4])();
    }
  }
  std::
  _Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
  ::~_Vector_base(&error_vectors.
                   super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
                 );
  return;
}

Assistant:

void NeuralNetwork::back_propogate(const std::vector<long double> &correct_data) const {
    // check to see if the given data set matches the size of the output vector
    if(correct_data.size() != layers[layers.size() - 1] -> data -> N) {
        throw std::length_error("Length of given dataset doesn't match up with output layer");
    }

    /* we need to amortize the error so we can quickly look it up later
    * the size that will actually be in use is layers.size() - 1 in practice but it makes it easier to access
    * I don't think there's any real reason to keep a vector of all the error vectors, since realistically
    * you're only going to be accessing the last ones, but it's nice to keep a reference of them anyway.
    * At some point the NeuralMatrix pointer will become a smart pointer and I'll be able to return these
    * without getting a bunch of cloggged up memory */
    std::vector< utilities::Matrix<long double> *> error_vectors(layers.size(), nullptr);
    // should create a copy of the last layer (output)
    // initialize last error vector to contain the values of the data vector's function
    error_vectors[error_vectors.size() - 1] =
            utilities::matrix_operators::create(layers[layers.size() - 1] -> data,
                                                utilities::matrix_operators::function);


    // data.size = length of output layer

    // loop creates the correct values for the error vector at the end
    for(register size_t i = 0; i < correct_data.size(); ++i) {
        error_vectors[error_vectors.size() - 1] -> matrix[i][0] =
                (layers[layers.size() - 1] -> data -> matrix[i][0] -> function - correct_data[i]) *
                layers[layers.size() - 1] -> data -> matrix[i][0] -> function_derivative;
    }
    utilities::Matrix<long double> *temp = NULL, *wt = NULL;
    long double del = 0;
    register size_t i = 0, j = 0, k = 0;
    // this loop performs the routine delta(l) = ((transpose(weight(l+1)) * delta(l+1)) * sigma'(z(l))
    for(i = error_vectors.size() - 2; i != 0; --i) {
        // here we have to get a copy of the transpose matrix
        wt = layers[i + 1] -> weights -> transpose();

        // this performs the matrix multiplication of weight(l+1)^T * delta(l+1)
        temp = *wt * error_vectors[i + 1];

        /* now that we have completed the matrix multiplication we'll need to actually compute the
         * element-wise product for ((w(l+1)^T) * delta(l+1)) (x) sigma'(z'(l)) */
        for(j = 0; j < temp -> N; ++j) {

            /* we'll set each individual element equal to the element wise product of the lefthand side and righthand
             * side of what should be two column vectors, we will update that value, save it, and then multiply it
             * by the learning rate, and save that as our del. This is what we'll subtract from the bias vector and
             * the weights matrix in order to back-propogate correctly
             */
            del = learning_rate * (temp -> matrix[j][0] *=
                                           layers[i] -> data -> matrix[j][0] -> function_derivative);
            // subtract the delta from the bias
            layers[i] -> bias -> matrix[j][0]-= del;
            // for the weight matrix, it's dC/d(w^(l)_{j,k}) = a^(l-1)_k * del(l)_j, so we have to multiply through
            // each value in order to update the weights matrix
            for(k = 0; k < layers[i - 1] -> data -> N; ++k) {
                layers[i] -> weights -> matrix[j][k] -= layers[i - 1] -> data -> matrix[k][0] -> data * del;
            }
        }
        temp -> print();
        /* finally, since we're done computing the hadamard product of the lefthand side and the righthand side
         * we place the temp pointer in our actual error_vectors vector and delete the transpose we used
         */
        error_vectors[i] = temp;
        delete wt;
    }
    // to make sure this works correctly
    if(error_vectors[0] != nullptr) {
        std::cerr << "Error: the 0th index of error_vector non-null\n";
    }

    for(auto& item : error_vectors) {
        delete item;
    }
}